

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O3

kStatus __thiscall
gnilk::Log::Info<char_const*,char_const*,char_const*,char_const*>
          (Log *this,char *arguments,char *arguments_1,char *arguments_2,char *arguments_3)

{
  int iVar1;
  size_t sVar2;
  kStatus kVar3;
  basic_string_view<char> format;
  basic_format_args<fmt::v10::basic_printf_context<char>_> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  string local_298;
  char *local_278 [2];
  char *local_268;
  char *local_258;
  buffer<char> local_248;
  char local_228 [504];
  
  kVar3 = kFiltered;
  if ((this->isEnabled == true) && ((int)this->logLevelThreshold < 0xc9)) {
    sVar2 = strlen(arguments);
    local_248.size_ = 0;
    local_248._vptr_buffer = (_func_int **)&PTR_grow_001da800;
    local_248.capacity_ = 500;
    format.size_ = sVar2;
    format.data_ = arguments;
    args.field_1.values_ = (value<fmt::v10::basic_printf_context<char>_> *)local_278;
    args.desc_ = 0xccc;
    local_278[0] = arguments_1;
    local_268 = arguments_2;
    local_258 = arguments_3;
    local_248.ptr_ = local_228;
    ::fmt::v10::detail::vprintf<char,fmt::v10::basic_printf_context<char>>(&local_248,format,args);
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_298,local_248.ptr_,local_248.ptr_ + local_248.size_);
    if (local_248.ptr_ != local_228) {
      operator_delete(local_248.ptr_,local_248.capacity_);
    }
    iVar1 = SendLogMessage(this,kInfo,&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    kVar3 = (uint)(iVar1 < 1) * 2;
  }
  return kVar3;
}

Assistant:

inline kStatus Info(T... arguments) const {
            if (!(isEnabled && WithinRange(kInfo))) return kStatus::kFiltered;
            auto str = fmt::sprintf(arguments...);
            return (SendLogMessage(kInfo, str) > 0) ? kStatus::kOk : kStatus::kSendError;
        }